

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseIncoming.cpp
# Opt level: O0

Result __thiscall
tonk::SessionIncoming::handleReliableMessage
          (SessionIncoming *this,uint messageType,uint8_t *messageData,uint messageBytes)

{
  long in_RCX;
  uint in_EDX;
  SessionIncoming *in_RSI;
  ErrorResult *in_RDI;
  uint in_stack_000000e4;
  uint8_t *in_stack_000000e8;
  undefined4 in_stack_000000f0;
  uint in_stack_000000f4;
  uint8_t *in_stack_000000f8;
  uint in_stack_00000104;
  SessionIncoming *in_stack_00000108;
  
  if (in_EDX == 5) {
    insertUncompressed(in_RSI,(uint8_t *)in_RDI);
    onCompressed((SessionIncoming *)CONCAT44(in_stack_000000f4,in_stack_000000f0),in_stack_000000e8,
                 in_stack_000000e4);
  }
  else {
    if ((in_RSI->FirstReliable == (uint8_t *)0x0) && (in_EDX < 0x1e)) {
      in_RSI->FirstReliable = (uint8_t *)(in_RCX + -2);
    }
    deliverMessage(in_stack_00000108,in_stack_00000104,in_stack_000000f8,in_stack_000000f4);
  }
  return (Result)in_RDI;
}

Assistant:

Result SessionIncoming::handleReliableMessage(
    unsigned messageType,
    const uint8_t* messageData,
    unsigned messageBytes)
{
    TONK_DEBUG_ASSERT(messageType >= protocol::MessageType_StartOfReliables);
    TONK_DEBUG_ASSERT(messageType != protocol::MessageType_Unordered);

    if (messageType == protocol::MessageType_Compressed)
    {
        TONK_VERBOSE_INCOMING_LOG("Handle compressed message block. messageBytes=", messageBytes);

        insertUncompressed(messageData - protocol::kMessageFrameBytes);

        return onCompressed(messageData, messageBytes);
    }

    // Remember the first reliable message that is not Control or Unordered.
    // These types are not included in the compression history buffer
    if (!FirstReliable && messageType < protocol::MessageType_Control) {
        FirstReliable = messageData - protocol::kMessageFrameBytes;
    }

    TONK_VERBOSE_INCOMING_LOG("Handle reliable messageType=", messageType, ". messageBytes=", messageBytes);

    return deliverMessage(messageType, messageData, messageBytes);
}